

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*>::reallocateAndGrow
          (QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *old)

{
  QArrayData *data;
  qsizetype toCopy;
  qsizetype qVar1;
  long lVar2;
  Data *pDVar3;
  long lVar4;
  Int IVar5;
  long lVar6;
  QResourceRoot **ppQVar7;
  long in_FS_OFFSET;
  pair<QArrayData_*,_void_*> pVar8;
  pair<QTypedArrayData<(anonymous_namespace)::QResourceRoot_*>_*,_(anonymous_namespace)::QResourceRoot_**>
  pVar9;
  QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  data = &this->d->super_QArrayData;
  if (((data == (QArrayData *)0x0 || where != GrowsAtEnd) || (n < 1)) ||
     (1 < (data->ref_)._q_value.super___atomic_base<int>._M_i)) {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QResourceRoot **)&DAT_aaaaaaaaaaaaaaaa;
    if (data == (QArrayData *)0x0) {
      qVar1 = 0;
    }
    else {
      qVar1 = data->alloc;
    }
    if (qVar1 < this->size) {
      qVar1 = this->size;
    }
    if (where == GrowsAtEnd) {
      lVar2 = freeSpaceAtEnd(this);
    }
    else {
      lVar2 = freeSpaceAtBegin(this);
    }
    lVar2 = (qVar1 + n) - lVar2;
    if (data == (QArrayData *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = data->alloc;
      lVar6 = lVar2;
      if (lVar2 < lVar4) {
        lVar6 = lVar4;
      }
      if (((data->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
           super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) {
        lVar2 = lVar6;
      }
    }
    pVar9 = QTypedArrayData<(anonymous_namespace)::QResourceRoot_*>::allocate
                      (lVar2,(uint)(lVar2 <= lVar4));
    ppQVar7 = pVar9.second;
    pDVar3 = pVar9.first;
    if (ppQVar7 != (QResourceRoot **)0x0 && pDVar3 != (Data *)0x0) {
      if (where == GrowsAtBeginning) {
        lVar4 = ((pDVar3->super_QArrayData).alloc - (this->size + n)) / 2;
        lVar2 = 0;
        if (0 < lVar4) {
          lVar2 = lVar4;
        }
        lVar2 = lVar2 + n;
      }
      else {
        lVar2 = freeSpaceAtBegin(this);
      }
      if (this->d == (Data *)0x0) {
        IVar5 = 0;
      }
      else {
        IVar5 = (this->d->super_QArrayData).flags.
                super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
                super_QFlagsStorage<QArrayData::ArrayOption>.i;
      }
      ppQVar7 = ppQVar7 + lVar2;
      (pDVar3->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
      super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar5;
    }
    local_48.size = 0;
    local_48.d = pDVar3;
    local_48.ptr = ppQVar7;
    if ((0 < n) && (ppQVar7 == (QResourceRoot **)0x0)) {
      local_48.ptr = (QResourceRoot **)0x0;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        local_48.ptr = ppQVar7;
        qBadAlloc();
      }
      goto LAB_00239458;
    }
    if (this->size != 0) {
      QtPrivate::QPodArrayOps<(anonymous_namespace)::QResourceRoot_*>::copyAppend
                ((QPodArrayOps<(anonymous_namespace)::QResourceRoot_*> *)&local_48,this->ptr,
                 this->ptr + this->size);
    }
    pDVar3 = this->d;
    ppQVar7 = this->ptr;
    this->d = local_48.d;
    this->ptr = local_48.ptr;
    qVar1 = this->size;
    this->size = local_48.size;
    local_48.d = pDVar3;
    local_48.ptr = ppQVar7;
    local_48.size = qVar1;
    ~QArrayDataPointer(&local_48);
  }
  else {
    lVar2 = data->alloc;
    qVar1 = freeSpaceAtEnd(this);
    pVar8 = QArrayData::reallocateUnaligned(data,this->ptr,8,(lVar2 - qVar1) + 1,Grow);
    if (pVar8.second == (void *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        qBadAlloc();
      }
      goto LAB_00239458;
    }
    this->d = (Data *)pVar8.first;
    this->ptr = (QResourceRoot **)pVar8.second;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00239458:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }